

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O3

Aig_Man_t *
Saig_ManRetimeMinArea
          (Aig_Man_t *p,int nMaxIters,int fForwardOnly,int fBackwardOnly,int fInitial,int fVerbose)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  Aig_Man_t *pNew;
  Vec_Ptr_t *pVVar4;
  Aig_Man_t *pNew_00;
  Aig_Man_t *pAVar5;
  bool bVar6;
  char *__s;
  int iVar7;
  
  pNew = Aig_ManDupSimple(p);
  if (0 < nMaxIters && fBackwardOnly == 0) {
    bVar6 = false;
    pAVar5 = pNew;
    iVar7 = nMaxIters;
    do {
      pNew = pAVar5;
      if (pAVar5->nRegs == 0) break;
      pVVar4 = Nwk_ManDeriveRetimingCut(pAVar5,1,fVerbose);
      if (pAVar5->nRegs <= pVVar4->nSize) {
        if (fVerbose != 0 && !bVar6) {
          puts("Forward retiming cannot reduce registers.");
        }
        if (pVVar4->pArray != (void **)0x0) {
          free(pVVar4->pArray);
        }
        free(pVVar4);
        break;
      }
      pNew = Saig_ManRetimeDupForward(pAVar5,pVVar4);
      Aig_ManStop(pAVar5);
      if (pVVar4->pArray != (void **)0x0) {
        free(pVVar4->pArray);
      }
      free(pVVar4);
      if (fVerbose != 0) {
        Aig_ManReportImprovement(p,pNew);
      }
      bVar6 = true;
      iVar7 = iVar7 + -1;
      pAVar5 = pNew;
    } while (iVar7 != 0);
  }
  if (fInitial == 0 && fForwardOnly == 0) {
    if (nMaxIters < 1) {
      return pNew;
    }
    bVar1 = 0;
    bVar6 = false;
    do {
      bVar2 = bVar6;
      if (pNew->nRegs == 0) break;
      pVVar4 = Nwk_ManDeriveRetimingCut(pNew,0,fVerbose);
      if (pNew->nRegs <= pVVar4->nSize) {
        if (!(bool)(fVerbose == 0 | bVar1)) {
          puts("Backward retiming cannot reduce registers.");
        }
        if (pVVar4->pArray != (void **)0x0) {
          free(pVVar4->pArray);
        }
        free(pVVar4);
        break;
      }
      pAVar5 = Saig_ManRetimeDupBackward(pNew,pVVar4,(Vec_Int_t *)0x0);
      Aig_ManStop(pNew);
      if (pVVar4->pArray != (void **)0x0) {
        free(pVVar4->pArray);
      }
      free(pVVar4);
      if (fVerbose != 0) {
        Aig_ManReportImprovement(p,pAVar5);
      }
      bVar1 = 1;
      bVar2 = true;
      nMaxIters = nMaxIters + -1;
      pNew = pAVar5;
      bVar6 = true;
    } while (nMaxIters != 0);
  }
  else {
    if ((fForwardOnly != 0 || fInitial == 0) || nMaxIters < 1) {
      return pNew;
    }
    bVar1 = 0;
    pAVar5 = pNew;
    bVar6 = false;
    do {
      bVar2 = bVar6;
      pNew = pAVar5;
      if (pAVar5->nRegs == 0) break;
      pNew_00 = Aig_ManDupSimple(pAVar5);
      pNew = Saig_ManRetimeMinAreaBackward(pNew_00,fVerbose);
      Aig_ManStop(pNew_00);
      if (pNew == (Aig_Man_t *)0x0) {
        pNew = pAVar5;
        if (!(bool)(fVerbose == 0 | bVar1)) {
          __s = "Backward retiming cannot reduce registers.";
          goto LAB_0063a591;
        }
        break;
      }
      iVar7 = pAVar5->nTruePos;
      iVar3 = pNew->nTruePos - iVar7;
      pNew->nRegs = pNew->nRegs + iVar3;
      pNew->nTruePis = pNew->nTruePis - iVar3;
      pNew->nTruePos = iVar7;
      Aig_ManStop(pAVar5);
      if (fVerbose != 0) {
        Aig_ManReportImprovement(p,pNew);
      }
      bVar1 = 1;
      bVar2 = true;
      nMaxIters = nMaxIters + -1;
      pAVar5 = pNew;
      bVar6 = true;
    } while (nMaxIters != 0);
  }
  if (bVar2 && (fInitial == 0 && fForwardOnly == 0)) {
    __s = "Assuming const-0 init-state after backward retiming. Result will not verify.";
    pAVar5 = pNew;
LAB_0063a591:
    puts(__s);
    pNew = pAVar5;
  }
  return pNew;
}

Assistant:

Aig_Man_t * Saig_ManRetimeMinArea( Aig_Man_t * p, int nMaxIters, int fForwardOnly, int fBackwardOnly, int fInitial, int fVerbose )
{
    Vec_Ptr_t * vCut;
    Aig_Man_t * pNew, * pTemp, * pCopy;
    int i, fChanges;
    pNew = Aig_ManDupSimple( p );
    // perform several iterations of forward retiming
    fChanges = 0;
    if ( !fBackwardOnly )
    for ( i = 0; i < nMaxIters; i++ )
    {
        if ( Saig_ManRegNum(pNew) == 0 )
            break;
        vCut = Nwk_ManDeriveRetimingCut( pNew, 1, fVerbose );
        if ( Vec_PtrSize(vCut) >= Aig_ManRegNum(pNew) )
        {
            if ( fVerbose && !fChanges )
                printf( "Forward retiming cannot reduce registers.\n" );
            Vec_PtrFree( vCut );
            break;
        }
        pNew = Saig_ManRetimeDupForward( pTemp = pNew, vCut );
        Aig_ManStop( pTemp );
        Vec_PtrFree( vCut );
        if ( fVerbose )
            Aig_ManReportImprovement( p, pNew );
        fChanges = 1;
    }
    // perform several iterations of backward retiming
    fChanges = 0;
    if ( !fForwardOnly && !fInitial )
    for ( i = 0; i < nMaxIters; i++ )
    {
        if ( Saig_ManRegNum(pNew) == 0 )
            break;
        vCut = Nwk_ManDeriveRetimingCut( pNew, 0, fVerbose );
        if ( Vec_PtrSize(vCut) >= Aig_ManRegNum(pNew) )
        {
            if ( fVerbose && !fChanges )
                printf( "Backward retiming cannot reduce registers.\n" );
            Vec_PtrFree( vCut );
            break;
        }
        pNew = Saig_ManRetimeDupBackward( pTemp = pNew, vCut, NULL );
        Aig_ManStop( pTemp );
        Vec_PtrFree( vCut );
        if ( fVerbose )
            Aig_ManReportImprovement( p, pNew );
        fChanges = 1;
    }
    else if ( !fForwardOnly && fInitial )
    for ( i = 0; i < nMaxIters; i++ )
    {
        if ( Saig_ManRegNum(pNew) == 0 )
            break;
        pCopy = Aig_ManDupSimple( pNew );
        pTemp = Saig_ManRetimeMinAreaBackward( pCopy, fVerbose );
        Aig_ManStop( pCopy );
        if ( pTemp == NULL )
        {
            if ( fVerbose && !fChanges )
                printf( "Backward retiming cannot reduce registers.\n" );
            break;
        }
        Saig_ManExposeBadRegs( pTemp, Saig_ManPoNum(pTemp) - Saig_ManPoNum(pNew) );
        Aig_ManStop( pNew );
        pNew = pTemp;
        if ( fVerbose )
            Aig_ManReportImprovement( p, pNew );
        fChanges = 1;
    }
    if ( !fForwardOnly && !fInitial && fChanges )
        printf( "Assuming const-0 init-state after backward retiming. Result will not verify.\n" );
    return pNew;
}